

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O3

bool __thiscall duckdb::PhysicalTableScan::Equals(PhysicalTableScan *this,PhysicalOperator *other_p)

{
  pointer pCVar1;
  bool bVar2;
  PhysicalTableScan *pPVar3;
  pointer pCVar4;
  pointer pCVar5;
  
  if ((this->super_PhysicalOperator).type == other_p->type) {
    pPVar3 = PhysicalOperator::Cast<duckdb::PhysicalTableScan>(other_p);
    if ((this->function).function == (pPVar3->function).function) {
      pCVar4 = (this->column_ids).
               super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_start;
      pCVar1 = (this->column_ids).
               super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pCVar5 = (pPVar3->column_ids).
               super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_start;
      if ((long)pCVar1 - (long)pCVar4 ==
          (long)(pPVar3->column_ids).
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pCVar5) {
        while( true ) {
          if (pCVar4 == pCVar1) {
            bVar2 = FunctionData::Equals
                              ((this->bind_data).
                               super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                               .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl,
                               (pPVar3->bind_data).
                               super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                               .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
            return bVar2;
          }
          if (pCVar4->index != pCVar5->index) break;
          pCVar4 = pCVar4 + 1;
          pCVar5 = pCVar5 + 1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool PhysicalTableScan::Equals(const PhysicalOperator &other_p) const {
	if (type != other_p.type) {
		return false;
	}
	auto &other = other_p.Cast<PhysicalTableScan>();
	if (function.function != other.function.function) {
		return false;
	}
	if (column_ids != other.column_ids) {
		return false;
	}
	if (!FunctionData::Equals(bind_data.get(), other.bind_data.get())) {
		return false;
	}
	return true;
}